

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int readline(void)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  char num [8];
  char acStack_38 [8];
  
  do {
    memset(prlnbuf,0x20,0x9e);
    if (expand_macro != 0) {
      if (mlptr != (t_line *)0x0) {
LAB_0010ce39:
        pbVar8 = (byte *)mlptr->data;
        iVar3 = 0x1a;
        break;
      }
      lVar6 = (long)midx;
      while (lVar6 != 1) {
        mlptr = *(t_line **)(&DAT_0011f9a8 + lVar6 * 8);
        lVar6 = lVar6 + -1;
        if (mlptr != (t_line *)0x0) {
          mcounter = mcntstack[lVar6];
          midx = (int)lVar6;
          goto LAB_0010ce39;
        }
      }
      midx = 0;
      mcounter = mcntstack[0];
      mlptr = (t_line *)0x0;
      expand_macro = 0;
    }
    iVar3 = slnum + 1;
    pcVar9 = prlnbuf + 4;
    slnum = iVar3;
    if (iVar3 != 0) {
      do {
        *pcVar9 = (char)iVar3 + (char)(iVar3 / 10) * -10 + '0';
        uVar4 = iVar3 + 9;
        pcVar9 = pcVar9 + -1;
        iVar3 = iVar3 / 10;
      } while (0x12 < uVar4);
    }
    iVar3 = getc((FILE *)in_fp);
    if (iVar3 != -1) {
      iVar11 = 0x1a;
      goto LAB_0010d028;
    }
    iVar3 = close_input();
    if (iVar3 != 0) {
      return -1;
    }
  } while( true );
LAB_0010ce4f:
  bVar2 = *pbVar8;
  if (bVar2 == 0x5c) {
    pbVar1 = pbVar8 + 2;
    bVar2 = pbVar8[1];
    prlnbuf[iVar3] = '\0';
    if (bVar2 == 0x40) {
      sprintf(acStack_38,"%05i",(ulong)(uint)mcounter);
      iVar11 = 5;
      pcVar9 = acStack_38;
      pbVar8 = pbVar1;
    }
    else if (bVar2 == 0x3f) {
      if (8 < (byte)(*pbVar1 - 0x31)) {
LAB_0010d002:
        pcVar9 = "Invalid macro argument index!";
        goto LAB_0010d009;
      }
      uVar4 = macro_getargtype(marg[midx][*pbVar1 - 0x31]);
      sprintf(acStack_38,"%i",(ulong)uVar4);
      iVar11 = 1;
      pcVar9 = acStack_38;
      pbVar8 = pbVar8 + 3;
    }
    else if (bVar2 == 0x23) {
      uVar7 = 10;
      lVar6 = 0x280;
      do {
        if (lVar6 == -0x50) {
          uVar7 = 0;
          break;
        }
        uVar7 = (ulong)((int)uVar7 - 1);
        pcVar9 = marg[midx][0] + lVar6;
        lVar6 = lVar6 + -0x50;
      } while (*pcVar9 == '\0');
      sprintf(acStack_38,"%i",uVar7);
      iVar11 = 1;
      pcVar9 = acStack_38;
      pbVar8 = pbVar1;
    }
    else {
      if (8 < (byte)(bVar2 - 0x31)) goto LAB_0010d002;
      pcVar9 = marg[midx][0] + (uint)(byte)(bVar2 - 0x31) * 0x50;
      sVar5 = strlen(pcVar9);
      iVar11 = (int)sVar5;
      pbVar8 = pbVar1;
    }
    iVar10 = iVar3 + iVar11;
    if (0x9c < iVar10) {
      pcVar9 = "Invalid line length!";
LAB_0010d009:
      error(pcVar9);
      return -1;
    }
    strncpy(prlnbuf + iVar3,pcVar9,(long)iVar11);
  }
  else {
    if (bVar2 == 0) {
      prlnbuf[iVar3] = '\0';
      mlptr = mlptr->next;
      return 0;
    }
    pbVar8 = pbVar8 + 1;
    iVar10 = iVar3 + 1;
    prlnbuf[iVar3] = bVar2;
  }
  iVar3 = iVar10;
  if (0x9c < iVar10) {
    iVar3 = 0x9d;
  }
  goto LAB_0010ce4f;
LAB_0010d028:
  if ((iVar3 == -1) || (iVar3 == 10)) goto LAB_0010d0ae;
  if (iVar3 == 0xd) {
    iVar3 = getc((FILE *)in_fp);
    if ((iVar3 != -1) && (iVar3 != 10)) {
      ungetc(iVar3,(FILE *)in_fp);
    }
LAB_0010d0ae:
    prlnbuf[iVar11] = '\0';
    return 0;
  }
  prlnbuf[iVar11] = (char)iVar3;
  iVar11 = (uint)(iVar11 < 0x9e) + iVar11;
  if (iVar3 == 9) {
    (&DAT_00329ebf)[iVar11] = 0x20;
    uVar4 = iVar11 - 0x14;
    if (-1 < (int)(iVar11 - 0x1bU)) {
      uVar4 = iVar11 - 0x1bU;
    }
    iVar11 = (uVar4 & 0xfffffff8) + 0x22;
  }
  iVar3 = getc((FILE *)in_fp);
  goto LAB_0010d028;
}

Assistant:

int
readline(void)
{
	char *ptr, *arg, num[8];
	int j, n;
	int	i;		/* pointer into prlnbuf */
	int	c;		/* current character		*/
	int	temp;	/* temp used for line number conversion */

start:
	for (i = 0; i < LAST_CH_POS; i++)
		prlnbuf[i] = ' ';

	/* if 'expand_macro' is set get a line from macro buffer instead */
	if (expand_macro) {
		if (mlptr == NULL) {
			while (mlptr == NULL) {
				midx--;
				mlptr = mstack[midx];
				mcounter = mcntstack[midx];
				if (midx == 0) {
					mlptr = NULL;
					expand_macro = 0;
					break;
				}
			}
		}

		/* expand line */
		if (mlptr) {
			i = SFIELD;
			ptr = mlptr->data;
			for (;;) {
				c = *ptr++;
				if (c == '\0')
					break;
				if (c != '\\')
					prlnbuf[i++] = c;
				else {
					c = *ptr++;
					prlnbuf[i] = '\0';

					/* \@ */
					if (c == '@') {
						n = 5;
						sprintf(num, "%05i", mcounter);
						arg = num;
					}

					/* \# */
					else if (c == '#') {
						for (j = 9; j > 0; j--)
							if (strlen(marg[midx][j - 1]))
								break;
						n = 1;
						sprintf(num, "%i", j);
						arg = num;
					}

					/* \?1 - \?9 */
					else if (c == '?') {
						c = *ptr++;
						if (c >= '1' && c <= '9') {
							n = 1;
							sprintf(num, "%i", macro_getargtype(marg[midx][c - '1']));
							arg = num;
						}
						else {
							error("Invalid macro argument index!");
							return (-1);
						}
					}

					/* \1 - \9 */
					else if (c >= '1' && c <= '9') {
						j   = c - '1';
						n   = strlen(marg[midx][j]);
						arg = marg[midx][j];
					}

					/* unknown macro special command */
					else {
						error("Invalid macro argument index!");
						return (-1);
					}

					/* check for line overflow */
					if ((i + n) >= LAST_CH_POS - 1) {
						error("Invalid line length!");
						return (-1);
					}

					/* copy macro string */
					strncpy(&prlnbuf[i], arg, n);
					i += n;
				}
				if (i >= LAST_CH_POS - 1)
					i  = LAST_CH_POS - 1;
			}
			prlnbuf[i] = '\0';
			mlptr = mlptr->next;
			return (0);
		}
	}

	/* put source line number into prlnbuf */
	i = 4;
	temp = ++slnum;
	while (temp != 0) {
		prlnbuf[i--] = temp % 10 + '0';
		temp /= 10;
	}

	/* get a line */
	i = SFIELD;
	c = getc(in_fp);
	if (c == EOF) {
		if (close_input())
			return (-1);
		goto start;
	}
	for (;;) {
		/* check for the end of line */
		if (c == '\r') {
			c = getc(in_fp);
			if (c == '\n' || c == EOF)
				break;
			ungetc(c, in_fp);
			break;
		}
		if (c == '\n' || c == EOF)
			break;

		/* store char in the line buffer */
		prlnbuf[i] = c;
		i += (i < LAST_CH_POS) ? 1 : 0;

		/* expand tab char to space */
		if (c == '\t') {
			prlnbuf[--i] = ' ';
			i += (8 - ((i - SFIELD) % 8));
		}

		/* get next char */
		c = getc(in_fp);
	}
	prlnbuf[i] = '\0';
	return(0);
}